

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticParser.h
# Opt level: O0

vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> * __thiscall
pbrt::SemanticParser::extractVector<pbrt::math::vec3i>(SemanticParser *this,SP *shape,string *name)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  int *piVar4;
  string *in_RDI;
  vec3i *data;
  size_t num;
  int dims;
  SP param;
  vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *result;
  vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *in_stack_ffffffffffffff58;
  vec3i *__last;
  __normal_iterator<pbrt::math::vec3i_*,_std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>_>
  in_stack_ffffffffffffff70;
  __normal_iterator<pbrt::math::vec3i_*,_std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>_>
  __result;
  string *this_00;
  vec3i local_38;
  byte local_21;
  
  local_21 = 0;
  this_00 = in_RDI;
  std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::vector
            ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)0x1a8706);
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a8710);
  syntactic::ParamSet::findParam<int>((ParamSet *)this_00,in_RDI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_38);
  if (bVar1) {
    __result._M_current = &local_38;
    peVar2 = std::
             __shared_ptr_access<pbrt::syntactic::ParamArray<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a8755);
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      (&peVar2->super_vector<int,_std::allocator<int>_>);
    std::
    __shared_ptr_access<pbrt::syntactic::ParamArray<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a877a);
    piVar4 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x1a8786);
    std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::resize
              ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)in_RDI,
               (size_type)__result._M_current);
    __last = (vec3i *)(piVar4 + (sVar3 / 3) * 3);
    std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::begin
              (in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff70 =
         std::
         copy<pbrt::math::vec3i_const*,__gnu_cxx::__normal_iterator<pbrt::math::vec3i*,std::vector<pbrt::math::vec3i,std::allocator<pbrt::math::vec3i>>>>
                   (in_stack_ffffffffffffff70._M_current,__last,__result);
  }
  local_21 = 1;
  std::shared_ptr<pbrt::syntactic::ParamArray<int>_>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::ParamArray<int>_> *)0x1a882a);
  if ((local_21 & 1) == 0) {
    std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::~vector
              ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)
               in_stack_ffffffffffffff70._M_current);
  }
  return (vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)this_00;
}

Assistant:

std::vector<T> extractVector(pbrt::syntactic::Shape::SP shape, const std::string &name)
    {
      std::vector<T> result;
      typename ParamArray<typename T::scalar_t>::SP param = shape->findParam<typename T::scalar_t>(name);
      if (param) {

        int dims = sizeof(T)/sizeof(typename T::scalar_t);
        size_t num = param->size() / dims;// / T::dims;
        const T *const data = (const T*)param->data();
        
        result.resize(num);
        std::copy(data,data+num,result.begin());
      }
      return result;
    }